

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

bool __thiscall
argvParser::checkNextArgumentIfEnum(argvParser *this,argument *arg,char *nextElement)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  ulong uVar5;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [55];
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  char *local_28;
  char *nextElement_local;
  argument *arg_local;
  argvParser *this_local;
  
  if ((arg != (argument *)0x0) &&
     (local_28 = nextElement, nextElement_local = (char *)arg, arg_local = (argument *)this,
     bVar2 = std::operator!=(&arg->enums,""), pcVar1 = local_28, bVar2)) {
    psVar3 = (string *)(nextElement_local + 0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::operator+(local_48,(char *)local_68);
    lVar4 = std::__cxx11::string::find(psVar3,(ulong)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (lVar4 != -1) {
      return true;
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_argParserAdvancedConfiguration).lastFailedArg,
                 (string *)(nextElement_local + 0x20));
      std::operator+((char *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1168e2);
      std::operator+(local_120,(char *)local_140);
      std::operator+(local_100,local_120);
      std::operator+(local_e0,(char *)local_100);
      std::operator+(local_c0,(char *)local_e0);
      std::operator+(local_a0,(char *)local_c0);
      std::__cxx11::string::operator+=
                ((string *)&(this->super_argParserAdvancedConfiguration).errorMessage,
                 (string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string(local_140);
      return false;
    }
  }
  return true;
}

Assistant:

bool argvParser::checkNextArgumentIfEnum(argument * arg, char *nextElement) {

    if (arg != nullptr && arg->enums != "") {
        if (arg->enums.find(string(nextElement) + " ") != string::npos)
            return true;
        else if (!arg->enums.empty()) {
            lastFailedArg = arg->argLong;
            errorMessage += "\"" + arg->argLong + "\" does  accept \"" + arg->enums + "\" but not \"" +
                            nextElement + "\"\n";
            return false;
        }


    }
    return true;
}